

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlParserInputBufferPtr
xmlNewInputBufferMemory(void *mem,size_t size,xmlParserInputFlags flags,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr pxVar1;
  undefined8 *puVar2;
  xmlBufPtr pxVar3;
  
  if ((flags & (XML_INPUT_BUF_ZERO_TERMINATED|XML_INPUT_BUF_STATIC)) == XML_INPUT_BUF_STATIC) {
    pxVar1 = xmlAllocParserInputBuffer(enc);
    if (pxVar1 != (xmlParserInputBufferPtr)0x0) {
      puVar2 = (undefined8 *)(*xmlMalloc)(0x10);
      if (puVar2 != (undefined8 *)0x0) {
        *puVar2 = mem;
        puVar2[1] = size;
        pxVar1->context = puVar2;
        pxVar1->readcallback = xmlMemRead;
        pxVar1->closecallback = xmlMemClose;
        return pxVar1;
      }
      xmlFreeParserInputBuffer(pxVar1);
    }
  }
  else {
    pxVar1 = (xmlParserInputBufferPtr)(*xmlMalloc)(0x40);
    if (pxVar1 != (xmlParserInputBufferPtr)0x0) {
      pxVar1->compressed = 0;
      pxVar1->error = 0;
      pxVar1->rawconsumed = 0;
      pxVar1->buffer = (xmlBufPtr)0x0;
      pxVar1->raw = (xmlBufPtr)0x0;
      pxVar1->closecallback = (xmlInputCloseCallback)0x0;
      pxVar1->encoder = (xmlCharEncodingHandlerPtr)0x0;
      pxVar1->context = (void *)0x0;
      pxVar1->readcallback = (xmlInputReadCallback)0x0;
      pxVar1->compressed = -1;
      pxVar3 = xmlBufCreateMem((xmlChar *)mem,size,flags >> 1 & 1);
      pxVar1->buffer = pxVar3;
      if (pxVar3 != (xmlBufPtr)0x0) {
        return pxVar1;
      }
      (*xmlFree)(pxVar1);
    }
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlNewInputBufferMemory(const void *mem, size_t size,
                        xmlParserInputFlags flags, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if ((flags & XML_INPUT_BUF_STATIC) &&
        ((flags & XML_INPUT_BUF_ZERO_TERMINATED) == 0)) {
        xmlMemIOCtxt *ctxt;

        /*
         * Static buffer without zero terminator.
         * Stream memory to avoid a copy.
         */
        ret = xmlAllocParserInputBuffer(enc);
        if (ret == NULL)
            return(NULL);

        ctxt = xmlMalloc(sizeof(*ctxt));
        if (ctxt == NULL) {
            xmlFreeParserInputBuffer(ret);
            return(NULL);
        }

        ctxt->cur = mem;
        ctxt->size = size;

        ret->context = ctxt;
        ret->readcallback = xmlMemRead;
        ret->closecallback = xmlMemClose;
    } else {
        ret = xmlMalloc(sizeof(*ret));
        if (ret == NULL)
            return(NULL);
        memset(ret, 0, sizeof(xmlParserInputBuffer));
        ret->compressed = -1;

        ret->buffer = xmlBufCreateMem((const xmlChar *) mem, size,
                                      (flags & XML_INPUT_BUF_STATIC ? 1 : 0));
        if (ret->buffer == NULL) {
            xmlFree(ret);
            return(NULL);
        }
    }

    return(ret);
}